

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O3

double __thiscall packing::AssignedProtos::relSizeOf(AssignedProtos *this,ProtoPalette *protoPal)

{
  __normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  difference_type dVar4;
  __normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var5;
  Iter<__gnu_cxx::__normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::add_const_t>
  __first;
  Iter<__gnu_cxx::__normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::add_const_t>
  __last;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_src_gfx_pal_packing_cpp:212:43)>
  __pred;
  uint16_t color;
  value_type_conflict2 local_2a;
  double local_28;
  
  pvVar2 = ProtoPalette::begin(protoPal);
  pvVar3 = ProtoPalette::end(protoPal);
  if (pvVar2 == pvVar3) {
    local_28 = 0.0;
  }
  else {
    local_28 = 0.0;
    do {
      local_2a = *pvVar2;
      _Var5._M_current =
           (this->_assigned).
           super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      _Var1._M_current =
           (this->_assigned).
           super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      while ((_Var5._M_current != _Var1._M_current &&
             (((_Var5._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
              _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
              super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false))) {
        _Var5._M_current = _Var5._M_current + 1;
      }
      __first._iter._M_current = _Var5._M_current;
      __first._array = &this->_assigned;
      __last._iter._M_current = _Var1._M_current;
      __last._array = &this->_assigned;
      __pred._M_pred.color = &local_2a;
      __pred._M_pred.this = this;
      dVar4 = std::
              __count_if<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::add_const_t>,__gnu_cxx::__ops::_Iter_pred<packing::AssignedProtos::relSizeOf(ProtoPalette_const&)const::_lambda(packing::ProtoPalAttrs_const&)_1_>>
                        (__first,__last,__pred);
      local_28 = local_28 + 1.0 / (double)(dVar4 + 1);
      pvVar2 = pvVar2 + 1;
    } while (pvVar2 != pvVar3);
  }
  return local_28;
}

Assistant:

double relSizeOf(ProtoPalette const &protoPal) const {
		// NOTE: this function must not call `uniqueColors`, or one of its callers will break!
		double relSize = 0.;
		for (uint16_t color : protoPal) {
			auto n = std::count_if(begin(), end(), [this, &color](ProtoPalAttrs const &attrs) {
				ProtoPalette const &pal = (*_protoPals)[attrs.protoPalIndex];
				return std::find(pal.begin(), pal.end(), color) != pal.end();
			});
			// NOTE: The paper and the associated code disagree on this: the code has
			// this `1 +`, whereas the paper does not; its lack causes a division by 0
			// if the symbol is not found anywhere, so I'm assuming the paper is wrong.
			relSize += 1. / (1 + n);
		}
		return relSize;
	}